

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void hta::
     throw_exception<hta::Exception,char_const*,std::filesystem::__cxx11::path,char_const*,long,char_const*,unsigned_long>
               (char *args,path *args_1,char *args_2,long args_3,char *args_4,unsigned_long args_5)

{
  Exception *this;
  string local_220;
  path local_1f0;
  make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_long,_const_char_*,_unsigned_long>
  local_1c1;
  stringstream local_1c0 [8];
  stringstream msg;
  unsigned_long args_local_5;
  char *args_local_4;
  long args_local_3;
  char *args_local_2;
  path *args_local_1;
  char *args_local;
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  Catch::clara::std::filesystem::__cxx11::path::path(&local_1f0,(path *)args_1);
  detail::
  make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_long,_const_char_*,_unsigned_long>
  ::operator()(&local_1c1,(stringstream *)local_1c0,args,(path *)&local_1f0,args_2,args_3,args_4,
               args_5);
  Catch::clara::std::filesystem::__cxx11::path::~path(&local_1f0);
  this = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  Exception::Exception(this,&local_220);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}